

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O0

DLword * freestackblock(DLword n,StackWord *start68k,int align)

{
  ushort uVar1;
  DLword DVar2;
  STKBLK *pSVar3;
  DLword *pDVar4;
  ushort local_42;
  STKBLK *pSStack_40;
  DLword freesize;
  StackWord *easp68k;
  STKBLK *freeptr68k;
  StackWord *scanptr68k;
  int wantedsize;
  int align_local;
  StackWord *start68k_local;
  DLword n_local;
  
  if ((uint)n % 2 != 0) {
    error("asking for odd-length stack block");
  }
  pSStack_40 = (STKBLK *)NativeAligned2FromStackOffset(InterfacePage->endofstack);
  do {
    freeptr68k = (STKBLK *)start68k;
    if (start68k == (StackWord *)0x0) {
      freeptr68k = (STKBLK *)NativeAligned2FromStackOffset(InterfacePage->stackbase);
    }
LAB_0014da9f:
    do {
      uVar1 = *(ushort *)((ulong)freeptr68k ^ 2) >> 0xd;
      if (uVar1 == 5) {
LAB_0014db94:
        local_42 = freeptr68k->size;
        while( true ) {
          while( true ) {
            pSVar3 = (STKBLK *)(&freeptr68k->size + (int)(uint)local_42);
            if (local_42 == 0) {
              error("FREESIZE = 0");
            }
            uVar1 = *(ushort *)((ulong)pSVar3 ^ 2) >> 0xd;
            if (uVar1 != 5) break;
            local_42 = local_42 + pSVar3->size;
          }
          if ((uVar1 != 7) || (pSStack_40 <= pSVar3)) break;
          local_42 = local_42 + pSVar3->size;
        }
        if (n + 800 <= (uint)local_42) {
          if ((align < 0) || (DVar2 = StackOffsetFromNative(freeptr68k), align == (uint)DVar2 % 4))
          {
            scanptr68k._0_4_ = 0x20;
          }
          else {
            scanptr68k._0_4_ = 0x22;
          }
          pDVar4 = &freeptr68k->size + (int)(uint)scanptr68k;
          if (n == 0) {
            error("creating 0 length stack guard block");
          }
          if ((n & 1) != 0) {
            error("creating odd sized stack guard block");
          }
          *(uint *)pDVar4 = n | 0xe0000000;
          if ((uint)scanptr68k == 0) {
            error("creating 0 length free stack block");
          }
          *freeptr68k = (STKBLK)((uint)scanptr68k | 0xa0000000);
          if ((int)((local_42 - (uint)scanptr68k) - (uint)n) < 1) {
            error("creating 0 length free stack block");
          }
          if ((local_42 - n & 1) != 0) {
            error("creating odd length free stack block");
          }
          *(uint *)(pDVar4 + (int)(uint)n) =
               (local_42 - (uint)scanptr68k) - (uint)n & 0xffff | 0xa0000000;
          return pDVar4;
        }
        if (local_42 == 0) {
          error("creating 0 length free stack block");
        }
        if ((local_42 & 1) != 0) {
          error("creating odd length free stack block");
        }
        *freeptr68k = (STKBLK)(local_42 | 0xa0000000);
        freeptr68k = pSVar3;
      }
      else if (uVar1 == 6) {
        freeptr68k = (STKBLK *)NativeAligned2FromStackOffset(freeptr68k[2].flagword);
      }
      else {
        if (uVar1 == 7) {
          if (freeptr68k < pSStack_40) goto LAB_0014db94;
          if (start68k == (StackWord *)0x0) break;
          freeptr68k = (STKBLK *)NativeAligned2FromStackOffset(InterfacePage->stackbase);
          goto LAB_0014da9f;
        }
        for (; *(ushort *)((ulong)freeptr68k ^ 2) >> 0xd != 4; freeptr68k = freeptr68k + 1) {
        }
        freeptr68k = freeptr68k + 1;
      }
    } while (freeptr68k != (STKBLK *)start68k);
    pSStack_40 = (STKBLK *)extendstack();
    if (pSStack_40 == (STKBLK *)0x0) {
      warn("freestackblock:StackFull MP9319");
      return (DLword *)0x0;
    }
  } while( true );
}

Assistant:

DLword *freestackblock(DLword n, StackWord *start68k, int align)
/* size you want(in DLword) */
/* searching will start68k at here */
/* if Negative,it needn't align */
{
  int wantedsize;
  StackWord *scanptr68k;
  STKBLK *freeptr68k;
  StackWord *easp68k;
  DLword freesize;

  DLword *extendstack(void);

  if (n % 2) error("asking for odd-length stack block");

  /* compute actually size you needed */
  wantedsize = n + STACKAREA_SIZE + MINEXTRASTACKWORDS;

  easp68k = (StackWord *)(NativeAligned2FromStackOffset(InterfacePage->endofstack));

  /*** DEBUG ***/
  S_CHECK(n > 2, "asking for block < 2 words long");
  S_CHECK(start68k != 0, "start68k = 0");
  S_CHECK(start68k >= (StackWord *)NativeAligned2FromStackOffset(InterfacePage->stackbase),
          "start68k before stack base");

STARTOVER:
  if (start68k)
    scanptr68k = start68k;
  else
    scanptr68k = (StackWord *)NativeAligned2FromStackOffset(InterfacePage->stackbase);

SCAN:
  switch ((unsigned)(STKWORD(scanptr68k)->flags)) {
    case STK_FSB: goto FREESCAN;
    case STK_GUARD:
      if ((UNSIGNED)scanptr68k < (UNSIGNED)easp68k) goto FREESCAN;
      if (start68k) {
        scanptr68k = (StackWord *)NativeAligned2FromStackOffset(InterfacePage->stackbase);
        goto SCAN;
      } else
        goto NEWPAGE;
    case STK_FX:
      scanptr68k = (StackWord *)NativeAligned2FromStackOffset(((FX *)scanptr68k)->nextblock);
      break;
    default: {
#ifdef STACKCHECK
      StackWord *orig68k = scanptr68k;
#endif
      while (STKWORD(scanptr68k)->flags != STK_BF) {
        S_WARN(STKWORD(scanptr68k)->flags == STK_NOTFLG, "NOTFLG not on", (void *)scanptr68k);
        scanptr68k = (StackWord *)(((DLword *)scanptr68k) + DLWORDSPER_CELL);
      }

#ifdef STACKCHECK
      if (((Bframe *)scanptr68k)->residual) {
        if (scanptr68k != orig68k) {
          WARN("freestackblock:scanptr68k !=org", printf(":0x%x\n", LAddrFromNative(scanptr68k)));
          return 0; /* ? */
        }
      } else {
        if (((Bframe *)scanptr68k)->ivar != StackOffsetFromNative(orig68k)) {
          WARN("BF doesn't point TopIVAR", printf(":0x%x\n", LAddrFromNative(scanptr68k)));
          return 0; /* ? */
        }
      }
#endif
      /* Used to be a +=, but SunOS4/Sparc compiles it wrong */
      scanptr68k = (StackWord *)((DLword *)scanptr68k + DLWORDSPER_CELL);
      break;
    }
  } /* end switch(scanptr68k */

NEXT:
  if (scanptr68k != start68k) {
    S_CHECK((UNSIGNED)scanptr68k <= (UNSIGNED)easp68k, "scan ptr past end of stack");
    goto SCAN;
  }
NEWPAGE:
  easp68k = (StackWord *)extendstack();
  if (easp68k)
    goto STARTOVER;
  else {
    warn("freestackblock:StackFull MP9319");
    return (0);
  }

FREESCAN:
  freeptr68k = (STKBLK *)scanptr68k;
  freesize = FSB_size(freeptr68k);
FREE:
  scanptr68k = (StackWord *)(((DLword *)freeptr68k) + freesize);
  if (freesize == 0) error("FREESIZE = 0");

  switch ((unsigned)(STKWORD(scanptr68k)->flags)) {
    case STK_FSB: freesize = freesize + FSB_size(scanptr68k); goto FREE;

    case STK_GUARD:
      if ((UNSIGNED)scanptr68k < (UNSIGNED)easp68k) {
        freesize = freesize + FSB_size(scanptr68k);
        goto FREE;
      }
      break;

    default: break;

  } /* end switch(scanp.. */

  if (freesize >= wantedsize) {
    if ((align < 0) || (align == (StackOffsetFromNative(freeptr68k) % DLWORDSPER_QUAD)))
      wantedsize = MINEXTRASTACKWORDS;
    else
      wantedsize = MINEXTRASTACKWORDS + DLWORDSPER_CELL;

    scanptr68k = (StackWord *)(((DLword *)freeptr68k) + wantedsize);

    SETUPGUARDBLOCK(scanptr68k, n);
    MAKEFREEBLOCK(freeptr68k, wantedsize);
    MAKEFREEBLOCK(((DLword *)scanptr68k) + n, freesize - wantedsize - n);
    return ((DLword *)scanptr68k);
  } else
    MAKEFREEBLOCK(freeptr68k, freesize);

  goto NEXT;
}